

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_GetMethodElement
              (Var instance,Var index,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  IndexType IVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  int32 hCode;
  ImplicitCallFlags IVar8;
  PropertyRecord *local_68;
  PropertyRecord *debugPropertyRecord;
  RecyclableObject *object;
  uint32 local_4c;
  PropertyRecord *pPStack_48;
  uint32 indexVal;
  PropertyRecord *propertyRecord;
  Var value;
  
  debugPropertyRecord = (PropertyRecord *)0x0;
  BVar3 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&debugPropertyRecord);
  if (BVar3 == 0) {
    pJVar7 = GetPropertyDisplayNameForError(index,scriptContext);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,pJVar7);
  }
  this = scriptContext->threadContext;
  value._7_1_ = this->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this);
  pPStack_48 = (PropertyRecord *)0x0;
  propertyRecord = (PropertyRecord *)0x0;
  object = (RecyclableObject *)
           JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(index,scriptContext);
  IVar4 = GetIndexTypeFromPrimitive
                    (object,scriptContext,&local_4c,&stack0xffffffffffffffb8,
                     (JavascriptString **)0x0,false,false);
  if (IVar4 == IndexType_PropertyId) {
LAB_00abcda9:
    if (pPStack_48 == (PropertyRecord *)0x0) {
      bVar2 = CanShortcutOnUnknownPropertyName((RecyclableObject *)debugPropertyRecord);
      if (!bVar2) {
        IVar4 = GetIndexTypeFromPrimitive
                          (object,scriptContext,&local_4c,&stack0xffffffffffffffb8,
                           (JavascriptString **)0x0,true,false);
        if (IVar4 != IndexType_PropertyId) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x116a,"(indexType == IndexType_PropertyId)",
                                      "indexType == IndexType_PropertyId");
          if (!bVar2) goto LAB_00abd026;
          *puVar6 = 0;
        }
        if (pPStack_48 == (PropertyRecord *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x116b,"(propertyRecord != nullptr)",
                                      "propertyRecord != nullptr");
          if (!bVar2) goto LAB_00abd026;
          *puVar6 = 0;
        }
      }
    }
    if (pPStack_48 == (PropertyRecord *)0x0) {
      pJVar7 = JavascriptConversion::ToString(object,scriptContext);
      ScriptContext::GetOrAddPropertyRecord(scriptContext,pJVar7,&local_68);
      BVar3 = 0;
      BVar5 = GetPropertyReference_Internal
                        (instance,(RecyclableObject *)debugPropertyRecord,false,local_68->pid,
                         &propertyRecord,scriptContext,(PropertyValueInfo *)0x0);
      if (BVar5 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1179,
                                    "(!JavascriptOperators::GetPropertyReference(instance, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext, __null))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar2) {
LAB_00abd026:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
    else {
      BVar3 = GetPropertyReference_Internal
                        (instance,(RecyclableObject *)debugPropertyRecord,false,pPStack_48->pid,
                         &propertyRecord,scriptContext,(PropertyValueInfo *)0x0);
    }
  }
  else {
    if (IVar4 != IndexType_Number) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1165,"(indexType == IndexType_PropertyId)",
                                  "indexType == IndexType_PropertyId");
      if (!bVar2) goto LAB_00abd026;
      *puVar6 = 0;
      goto LAB_00abcda9;
    }
    BVar3 = GetItemReference(instance,(RecyclableObject *)debugPropertyRecord,local_4c,
                             &propertyRecord,scriptContext);
    IVar4 = IndexType_Number;
  }
  IVar8 = value._7_1_;
  if (BVar3 == 0) {
    if ((pPStack_48 == (PropertyRecord *)0x0 || IVar4 != IndexType_PropertyId) ||
       (pPStack_48->isSymbol != true)) {
      pJVar7 = JavascriptConversion::ToString(object,scriptContext);
    }
    else {
      pJVar7 = JavascriptSymbol::ToString(pPStack_48,scriptContext);
    }
    hCode = -0x7ff5fe4a;
  }
  else {
    bVar2 = JavascriptConversion::IsCallable(propertyRecord);
    IVar8 = value._7_1_;
    if (bVar2) goto LAB_00abcfe9;
    pJVar7 = JavascriptConversion::ToString(object,scriptContext);
    hCode = -0x7ff5ec45;
  }
  propertyRecord =
       (PropertyRecord *)ThrowErrorObject::CreateThrowTypeErrorObject(scriptContext,hCode,pJVar7);
LAB_00abcfe9:
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
  this->implicitCallFlags = this->implicitCallFlags | IVar8;
  return propertyRecord;
}

Assistant:

Var JavascriptOperators::OP_GetMethodElement(Var instance, Var index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetMethodElement);
        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined, GetPropertyDisplayNameForError(index, scriptContext));
        }

        ThreadContext* threadContext = scriptContext->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        Var value = NULL;
        BOOL hasProperty = FALSE;
        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

        if (indexType == IndexType_Number)
        {
            hasProperty = JavascriptOperators::GetItemReference(instance, object, indexVal, &value, scriptContext);
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);

            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                hasProperty = JavascriptOperators::GetPropertyReference(instance, object, propertyRecord->GetPropertyId(), &value, scriptContext, NULL);
            }
#if DBG
            else
            {
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::GetPropertyReference(instance, object, debugPropertyRecord->GetPropertyId(), &value, scriptContext, NULL),
                          "how did this property come? See OS Bug 2727708 if you see this come from the web");
            }
#endif
        }

        if (!hasProperty)
        {
            JavascriptString* varName = nullptr;
            if (indexType == IndexType_PropertyId && propertyRecord != nullptr && propertyRecord->IsSymbol())
            {
                varName = JavascriptSymbol::ToString(propertyRecord, scriptContext);
            }
            else
            {
                varName = JavascriptConversion::ToString(index, scriptContext);
            }

            // ES5 11.2.3 #2: We evaluate the call target but don't throw yet if target member is missing. We need to evaluate argList
            // first (#3). Postpone throwing error to invoke time.
            value = ThrowErrorObject::CreateThrowTypeErrorObject(scriptContext, VBSERR_OLENoPropOrMethod, varName);
        }
        else if(!JavascriptConversion::IsCallable(value))
        {
            // ES5 11.2.3 #2: We evaluate the call target but don't throw yet if target member is missing. We need to evaluate argList
            // first (#3). Postpone throwing error to invoke time.
            JavascriptString* varName = JavascriptConversion::ToString(index, scriptContext);
            value = ThrowErrorObject::CreateThrowTypeErrorObject(scriptContext, JSERR_Property_NeedFunction, varName);
        }

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
        return value;
        JIT_HELPER_END(Op_GetMethodElement);
    }